

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O0

void p_shm_free(PShm *shm)

{
  PShm *shm_local;
  
  if (shm != (PShm *)0x0) {
    pp_shm_clean_handle(shm);
    if (shm->platform_key != (pchar *)0x0) {
      p_free(shm->platform_key);
    }
    p_free(shm);
  }
  return;
}

Assistant:

P_LIB_API void
p_shm_free (PShm *shm)
{
	if (P_UNLIKELY (shm == NULL))
		return;

	pp_shm_clean_handle (shm);

	if (P_LIKELY (shm->platform_key != NULL))
		p_free (shm->platform_key);

	p_free (shm);
}